

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.h
# Opt level: O0

void __thiscall mwheel::implementation::PluginUnloader::~PluginUnloader(PluginUnloader *this)

{
  bool bVar1;
  iterator this_00;
  function<void_()> *in_RDI;
  function<void_()> *x;
  iterator __end2;
  iterator __begin2;
  vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *__range2;
  vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
  *in_stack_ffffffffffffffc8;
  __normal_iterator<std::function<void_()>_*,_std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
  local_18 [3];
  
  local_18[0]._M_current =
       (function<void_()> *)
       std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::begin
                 (in_stack_ffffffffffffffc8);
  this_00 = std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::end
                      (in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::function<void_()>_*,_std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
                        *)in_RDI,
                       (__normal_iterator<std::function<void_()>_*,_std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
                        *)in_stack_ffffffffffffffc8);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::function<void_()>_*,_std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
    ::operator*(local_18);
    std::function<void_()>::operator()(in_RDI);
    __gnu_cxx::
    __normal_iterator<std::function<void_()>_*,_std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
    ::operator++(local_18);
  }
  std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~vector
            ((vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)
             this_00._M_current);
  return;
}

Assistant:

~PluginUnloader() {
    for (const auto &x : m_callback) {
      x();
    }
  }